

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeEventPoolGetIpcHandle(ze_event_pool_handle_t hEventPool,ze_ipc_event_pool_handle_t *phIpc)

{
  ze_pfnEventPoolGetIpcHandle_t pfnGetIpcHandle;
  dditable_t *dditable;
  ze_result_t result;
  ze_ipc_event_pool_handle_t *phIpc_local;
  ze_event_pool_handle_t hEventPool_local;
  
  if (*(code **)(*(long *)(hEventPool + 8) + 0x468) == (code *)0x0) {
    hEventPool_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hEventPool_local._4_4_ =
         (**(code **)(*(long *)(hEventPool + 8) + 0x468))(*(undefined8 *)hEventPool,phIpc);
  }
  return hEventPool_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolGetIpcHandle(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of event pool object
        ze_ipc_event_pool_handle_t* phIpc               ///< [out] Returned IPC event handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_pool_object_t*>( hEventPool )->dditable;
        auto pfnGetIpcHandle = dditable->ze.EventPool.pfnGetIpcHandle;
        if( nullptr == pfnGetIpcHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEventPool = reinterpret_cast<ze_event_pool_object_t*>( hEventPool )->handle;

        // forward to device-driver
        result = pfnGetIpcHandle( hEventPool, phIpc );

        return result;
    }